

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsMultisigScript(Script *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ScriptOperator *this_00;
  byte local_99;
  ByteData local_48;
  ulong local_30;
  size_t i;
  int64_t num;
  int64_t req_num;
  Script *this_local;
  
  req_num = (int64_t)this;
  sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    (&this->script_stack_);
  if (3 < sVar4) {
    pvVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[](&this->script_stack_,0);
    bVar3 = ScriptElement::IsNumber(pvVar5);
    if (bVar3) {
      sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              size(&this->script_stack_);
      pvVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,sVar4 - 2);
      bVar3 = ScriptElement::IsNumber(pvVar5);
      if (bVar3) {
        sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                size(&this->script_stack_);
        pvVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,sVar4 - 1);
        this_00 = ScriptElement::GetOpCode(pvVar5);
        bVar3 = ScriptOperator::operator!=
                          (this_00,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
        if (!bVar3) {
          pvVar5 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,0);
          num = ScriptElement::GetNumber(pvVar5);
          sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ::size(&this->script_stack_);
          pvVar5 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,sVar4 - 2);
          i = ScriptElement::GetNumber(pvVar5);
          if (num < 0x11) {
            pvVar5 = ::std::
                     vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                     operator[](&this->script_stack_,0);
            bVar3 = ScriptElement::IsOpCode(pvVar5);
            if (!bVar3) {
              return false;
            }
          }
          if ((long)i < 0x11) {
            sVar4 = ::std::
                    vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                    size(&this->script_stack_);
            pvVar5 = ::std::
                     vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                     operator[](&this->script_stack_,sVar4 - 2);
            bVar3 = ScriptElement::IsOpCode(pvVar5);
            if (!bVar3) {
              return false;
            }
          }
          sVar2 = i;
          if (((num <= (long)i) && (num != 0)) &&
             (sVar4 = ::std::
                      vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                      size(&this->script_stack_), sVar2 == sVar4 - 3)) {
            local_30 = 1;
            while( true ) {
              uVar1 = local_30;
              sVar4 = ::std::
                      vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                      size(&this->script_stack_);
              if (sVar4 - 2 <= uVar1) {
                return true;
              }
              pvVar5 = ::std::
                       vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                       operator[](&this->script_stack_,local_30);
              bVar3 = ScriptElement::IsBinary(pvVar5);
              local_99 = 1;
              if (bVar3) {
                pvVar5 = ::std::
                         vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ::operator[](&this->script_stack_,local_30);
                ScriptElement::GetBinaryData(&local_48,pvVar5);
                bVar3 = Pubkey::IsValid(&local_48);
                local_99 = bVar3 ^ 0xff;
                ByteData::~ByteData(&local_48);
              }
              if ((local_99 & 1) != 0) break;
              local_30 = local_30 + 1;
            }
            return false;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Script::IsMultisigScript() const {
  if (script_stack_.size() < 4 || !script_stack_[0].IsNumber() ||
      !script_stack_[(script_stack_.size() - 2)].IsNumber() ||
      script_stack_[(script_stack_.size() - 1)].GetOpCode() !=
          ScriptOperator::OP_CHECKMULTISIG) {
    return false;
  }
  int64_t req_num = script_stack_[0].GetNumber();
  int64_t num = script_stack_[(script_stack_.size() - 2)].GetNumber();
  if (req_num <= 16 && !script_stack_[0].IsOpCode()) {
    return false;
  }
  if (num <= 16 && !script_stack_[(script_stack_.size() - 2)].IsOpCode()) {
    return false;
  }

  if (req_num > num || req_num == 0 ||
      num != static_cast<int64_t>(script_stack_.size() - 3)) {
    return false;
  }

  for (size_t i = 1; i < (script_stack_.size() - 2); ++i) {
    if (!script_stack_[i].IsBinary() ||
        !Pubkey::IsValid(script_stack_[i].GetBinaryData())) {
      return false;
    }
  }
  return true;
}